

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          vector<bool,_std::allocator<bool>_> *code,uint node,uint pos,ulint i)

{
  byte bVar1;
  uint uVar2;
  size_type sVar3;
  int in_ECX;
  uint in_EDX;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  undefined8 in_R8;
  uint next_node;
  ulint bit_rank;
  size_t in_stack_00000028;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000030;
  bool bit;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  reference local_40;
  undefined7 in_stack_ffffffffffffffd0;
  size_t local_8;
  
  local_40 = std::vector<bool,_std::allocator<bool>_>::at
                       (in_RDI,CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_40);
  std::
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator[]((vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)&in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish,(ulong)in_EDX);
  local_8 = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                      (in_stack_00000030,in_stack_00000028,bit_rank._7_1_);
  uVar2 = in_ECX + 1;
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_EDX,in_ECX));
  if (uVar2 != sVar3) {
    if ((bVar1 & 1) == 0) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,(ulong)in_EDX
                );
    }
    else {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,(ulong)in_EDX);
    }
    local_8 = rank(in_RSI,(vector<bool,_std::allocator<bool>_> *)CONCAT44(in_EDX,in_ECX),
                   (uint)((ulong)in_R8 >> 0x20),(uint)in_R8,
                   CONCAT17(bVar1,in_stack_ffffffffffffffd0));
  }
  return local_8;
}

Assistant:

inline ulint rank(vector<bool> * code, uint node, uint pos, ulint i){

		bool bit = code->at(pos);
		//ulint bit_rank = wavelet_tree[node].rank(bit,i);
		ulint bit_rank = wavelet_tree[node].rank(i,bit);

		if(pos+1==code->size())
			return bit_rank;

		uint next_node = (bit==0?child0[node]:child1[node]);//find next node

		return rank(code, next_node, pos+1, bit_rank);

	}